

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddEaRg<(moira::Instr)1,(moira::Mode)10,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)10,_2> src;
  Ea<(moira::Mode)10,_2> local_24;
  
  Op<(moira::Mode)10,2>(&local_24,this,op & 7,addr);
  cVar4 = 'a';
  lVar5 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "fdadd"[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = 'w';
  }
  else {
    cVar4 = '.';
    lVar5 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "$%x.w"[lVar5 + 4];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,&local_24);
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmAddEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}